

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

TypedExpectation<StrictMockProblemBuilder_&()> * __thiscall
testing::internal::TypedExpectation<StrictMockProblemBuilder_&()>::WillOnce
          (TypedExpectation<StrictMockProblemBuilder_&()> *this,
          Action<StrictMockProblemBuilder_&()> *action)

{
  bool bVar1;
  TypedExpectation<StrictMockProblemBuilder_&()> *in_RDI;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  ExpectationBase *in_stack_ffffffffffffff70;
  ExpectationBase *this_00;
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  ExpectationBase::ExpectSpecProperty
            (in_stack_ffffffffffffff70,SUB41((uint)in_stack_ffffffffffffff6c >> 0x18,0),
             (string *)0x2287f4);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  (in_RDI->super_ExpectationBase).last_clause_ = kWillOnce;
  operator_new(0x10);
  Action<StrictMockProblemBuilder_&()>::Action
            ((Action<StrictMockProblemBuilder_&()> *)in_stack_ffffffffffffff70,
             (Action<StrictMockProblemBuilder_&()> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::vector<const_void_*,_std::allocator<const_void_*>_>::push_back
            ((vector<const_void_*,_std::allocator<const_void_*>_> *)in_stack_ffffffffffffff70,
             (value_type *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  bVar1 = ExpectationBase::cardinality_specified(&in_RDI->super_ExpectationBase);
  if (!bVar1) {
    std::vector<const_void_*,_std::allocator<const_void_*>_>::size
              (&(in_RDI->super_ExpectationBase).untyped_actions_);
    this_00 = (ExpectationBase *)&stack0xffffffffffffffa0;
    Exactly(in_stack_ffffffffffffff6c);
    ExpectationBase::set_cardinality
              (this_00,(Cardinality *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))
    ;
    Cardinality::~Cardinality((Cardinality *)0x2288b0);
  }
  return in_RDI;
}

Assistant:

TypedExpectation& WillOnce(const Action<F>& action) {
    ExpectSpecProperty(last_clause_ <= kWillOnce,
                       ".WillOnce() cannot appear after "
                       ".WillRepeatedly() or .RetiresOnSaturation().");
    last_clause_ = kWillOnce;

    untyped_actions_.push_back(new Action<F>(action));
    if (!cardinality_specified()) {
      set_cardinality(Exactly(static_cast<int>(untyped_actions_.size())));
    }
    return *this;
  }